

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_grouping_function.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformGroupingFunction(Transformer *this,PGGroupingFunc *grouping)

{
  _Head_base<0UL,_duckdb::OperatorExpression_*,_false> this_00;
  pointer pOVar1;
  type expr;
  size_type in_RDX;
  pointer *__ptr;
  long lVar2;
  optional_ptr<duckdb::Transformer,_true> local_58;
  _Head_base<0UL,_duckdb::OperatorExpression_*,_false> local_50;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  size_type local_38;
  
  this_00._M_head_impl = (OperatorExpression *)operator_new(0x50);
  local_58.ptr = (Transformer *)0x0;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  OperatorExpression::OperatorExpression
            (this_00._M_head_impl,GROUPING_FUNCTION,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&stack0xffffffffffffffa8,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&stack0xffffffffffffffb8);
  local_50._M_head_impl = this_00._M_head_impl;
  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
      local_48._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  local_48._M_head_impl = (ParsedExpression *)0x0;
  local_40._M_head_impl = (ParsedExpression *)this;
  if (local_58.ptr != (Transformer *)0x0) {
    (*(code *)(((local_58.ptr)->parent).ptr)->options)();
  }
  lVar2 = *(long *)(*(long *)(in_RDX + 8) + 8);
  local_38 = in_RDX;
  if (lVar2 != 0) {
    do {
      pOVar1 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
               ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                             *)&stack0xffffffffffffffb0);
      TransformExpression((Transformer *)&stack0xffffffffffffffa8,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)grouping);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pOVar1->children,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&stack0xffffffffffffffa8);
      if (local_58.ptr != (Transformer *)0x0) {
        (*(code *)(((local_58.ptr)->parent).ptr)->options)();
      }
      lVar2 = *(long *)(lVar2 + 8);
    } while (lVar2 != 0);
  }
  expr = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
         ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                      *)&stack0xffffffffffffffb0);
  SetQueryLocation(&expr->super_ParsedExpression,*(int *)(local_38 + 0x24));
  *(OperatorExpression **)local_40._M_head_impl = local_50._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_40._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformGroupingFunction(duckdb_libpgquery::PGGroupingFunc &grouping) {
	auto op = make_uniq<OperatorExpression>(ExpressionType::GROUPING_FUNCTION);
	for (auto node = grouping.args->head; node; node = node->next) {
		auto n = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
		op->children.push_back(TransformExpression(n));
	}
	SetQueryLocation(*op, grouping.location);
	return std::move(op);
}